

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O0

void __thiscall QButtonGroup::setId(QButtonGroup *this,QAbstractButton *button,int id)

{
  long lVar1;
  QButtonGroupPrivate *key;
  int *piVar2;
  int in_EDX;
  long in_RSI;
  long in_FS_OFFSET;
  QButtonGroupPrivate *d;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = d_func((QButtonGroup *)0x51042e);
  if ((in_RSI != 0) && (in_EDX != -1)) {
    piVar2 = QHash<QAbstractButton_*,_int>::operator[]
                       ((QHash<QAbstractButton_*,_int> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                        (QAbstractButton **)key);
    *piVar2 = in_EDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QButtonGroup::setId(QAbstractButton *button, int id)
{
    Q_D(QButtonGroup);
    if (button && id != -1)
        d->mapping[button] = id;
}